

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_schema_entry.cpp
# Opt level: O2

optional_ptr<duckdb::CatalogEntry,_true> __thiscall
duckdb::DuckSchemaEntry::CreateIndex
          (DuckSchemaEntry *this,CatalogTransaction transaction,CreateIndexInfo *info,
          TableCatalogEntry *table)

{
  OnCreateConflict on_conflict;
  CatalogTransaction transaction_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  pointer pDVar3;
  optional_ptr<duckdb::CatalogEntry,_true> oVar4;
  CatalogException *this_00;
  _Head_base<0UL,_duckdb::StandardEntry_*,_false> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  DatabaseInstance *local_c8;
  ClientContext *pCStack_c0;
  Transaction *local_b8;
  transaction_t tStack_b0;
  transaction_t local_a8;
  LogicalDependencyList dependencies;
  _Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_60;
  
  LogicalDependencyList::AddDependency(&(info->super_CreateInfo).dependencies,(CatalogEntry *)table)
  ;
  if ((info->super_CreateInfo).on_conflict != IGNORE_ON_CONFLICT) {
    iVar2 = (*(table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
              _vptr_CatalogEntry[0x10])(table);
    bVar1 = DataTable::IndexNameIsUnique
                      ((DataTable *)CONCAT44(extraout_var,iVar2),&info->index_name);
    if (!bVar1) {
      this_00 = (CatalogException *)__cxa_allocate_exception(0x10);
      ::std::operator+(&local_e8,"An index with the name ",&info->index_name);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &dependencies,&local_e8," already exists!");
      CatalogException::CatalogException(this_00,(string *)&dependencies);
      __cxa_throw(this_00,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  make_uniq<duckdb::DuckIndexEntry,duckdb::Catalog&,duckdb::DuckSchemaEntry&,duckdb::CreateIndexInfo&,duckdb::TableCatalogEntry&>
            ((duckdb *)&local_e8,(this->super_SchemaCatalogEntry).super_InCatalogEntry.catalog,this,
             info,table);
  pDVar3 = unique_ptr<duckdb::DuckIndexEntry,_std::default_delete<duckdb::DuckIndexEntry>,_true>::
           operator->((unique_ptr<duckdb::DuckIndexEntry,_std::default_delete<duckdb::DuckIndexEntry>,_true>
                       *)&local_e8);
  ::std::
  _Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable((_Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)&dependencies,
               (_Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)&(pDVar3->super_IndexCatalogEntry).super_StandardEntry.dependencies);
  local_f0._M_head_impl = (StandardEntry *)local_e8._M_dataplus._M_p;
  local_a8 = transaction.start_time;
  local_e8._M_dataplus._M_p = (pointer)0x0;
  local_b8 = transaction.transaction.ptr;
  tStack_b0 = transaction.transaction_id;
  local_c8 = transaction.db.ptr;
  pCStack_c0 = transaction.context.ptr;
  on_conflict = (info->super_CreateInfo).on_conflict;
  ::std::
  _Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable(&local_60,
               (_Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)&dependencies);
  transaction_00.context.ptr = pCStack_c0;
  transaction_00.db.ptr = local_c8;
  transaction_00.transaction.ptr = local_b8;
  transaction_00.transaction_id = tStack_b0;
  transaction_00.start_time = local_a8;
  oVar4 = AddEntryInternal(this,transaction_00,
                           (unique_ptr<duckdb::StandardEntry,_std::default_delete<duckdb::StandardEntry>,_true>
                            *)&local_f0,on_conflict,(LogicalDependencyList *)&local_60);
  ::std::
  _Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_60);
  if (local_f0._M_head_impl != (StandardEntry *)0x0) {
    (*((local_f0._M_head_impl)->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[1])();
  }
  local_f0._M_head_impl = (StandardEntry *)0x0;
  ::std::
  _Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&dependencies);
  if ((long *)local_e8._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_e8._M_dataplus._M_p + 8))();
  }
  return (optional_ptr<duckdb::CatalogEntry,_true>)oVar4.ptr;
}

Assistant:

optional_ptr<CatalogEntry> DuckSchemaEntry::CreateIndex(CatalogTransaction transaction, CreateIndexInfo &info,
                                                        TableCatalogEntry &table) {
	info.dependencies.AddDependency(table);

	// currently, we can not alter PK/FK/UNIQUE constraints
	// concurrency-safe name checks against other INDEX catalog entries happens in the catalog
	if (info.on_conflict != OnCreateConflict::IGNORE_ON_CONFLICT &&
	    !table.GetStorage().IndexNameIsUnique(info.index_name)) {
		throw CatalogException("An index with the name " + info.index_name + " already exists!");
	}

	auto index = make_uniq<DuckIndexEntry>(catalog, *this, info, table);
	auto dependencies = index->dependencies;
	return AddEntryInternal(transaction, std::move(index), info.on_conflict, dependencies);
}